

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O2

int gz_next4(xz_statep state,unsigned_long *ret)

{
  byte *pbVar1;
  int iVar2;
  long lVar3;
  uInt uVar4;
  long lVar5;
  ulong uStack_30;
  
  uVar4 = (state->zstrm).avail_in;
  if (uVar4 == 0) {
    iVar2 = xz_avail_zstrm(state);
    uVar4 = (state->zstrm).avail_in;
    if (iVar2 == -1) {
      uStack_30 = 0xffffffffffffffff;
      goto LAB_001db2fe;
    }
    if (uVar4 != 0) goto LAB_001db2df;
    uStack_30 = 0xffffffffffffffff;
LAB_001db320:
    lVar5 = 0xffffff00;
    iVar2 = xz_avail_zstrm(state);
    uVar4 = (state->zstrm).avail_in;
    if (iVar2 == -1) goto LAB_001db361;
    if (uVar4 != 0) goto LAB_001db33e;
    lVar5 = uStack_30 + 0xffffff00;
LAB_001db373:
    iVar2 = xz_avail_zstrm(state);
    uVar4 = (state->zstrm).avail_in;
    if (iVar2 == -1) {
      lVar3 = -0x10000;
      goto LAB_001db3ac;
    }
    if (uVar4 != 0) goto LAB_001db38b;
    lVar5 = lVar5 + -0x10000;
  }
  else {
LAB_001db2df:
    uVar4 = uVar4 - 1;
    (state->zstrm).avail_in = uVar4;
    pbVar1 = (state->zstrm).next_in;
    (state->zstrm).next_in = pbVar1 + 1;
    uStack_30 = (ulong)*pbVar1;
LAB_001db2fe:
    if (uVar4 == 0) goto LAB_001db320;
LAB_001db33e:
    uVar4 = uVar4 - 1;
    (state->zstrm).avail_in = uVar4;
    pbVar1 = (state->zstrm).next_in;
    (state->zstrm).next_in = pbVar1 + 1;
    lVar5 = (ulong)*pbVar1 << 8;
LAB_001db361:
    lVar5 = uStack_30 + lVar5;
    if (uVar4 == 0) goto LAB_001db373;
LAB_001db38b:
    uVar4 = uVar4 - 1;
    (state->zstrm).avail_in = uVar4;
    pbVar1 = (state->zstrm).next_in;
    (state->zstrm).next_in = pbVar1 + 1;
    lVar3 = (ulong)*pbVar1 << 0x10;
LAB_001db3ac:
    lVar5 = lVar5 + lVar3;
    if (uVar4 != 0) goto LAB_001db3e2;
  }
  iVar2 = xz_avail_zstrm(state);
  if (iVar2 == -1) {
    return -1;
  }
  uVar4 = (state->zstrm).avail_in;
  if (uVar4 == 0) {
    return -1;
  }
LAB_001db3e2:
  (state->zstrm).avail_in = uVar4 - 1;
  pbVar1 = (state->zstrm).next_in;
  (state->zstrm).next_in = pbVar1 + 1;
  *ret = (ulong)*pbVar1 * 0x1000000 + lVar5;
  return 0;
}

Assistant:

static int
gz_next4(xz_statep state, unsigned long *ret)
{
    int ch;
    unsigned long val;
    z_streamp strm = &(state->zstrm);

    val = NEXTZ();
    val += (unsigned) NEXTZ() << 8;
    val += (unsigned long) NEXTZ() << 16;
    ch = NEXTZ();
    if (ch == -1)
        return -1;
    val += (unsigned long) ch << 24;
    *ret = val;
    return 0;
}